

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

Sym __thiscall covenant::CFG::replaceTerminal(CFG *this,Sym t)

{
  Sym LHS;
  Rule *RHS;
  TermFactory local_58;
  Rule local_48;
  
  if ((t.x & 1U) == 0) {
    LHS = newVar(this);
    local_58.px = (this->_tfac).px;
    local_58.pn.pi_ = (this->_tfac).pn.pi_;
    if (local_58.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_58.pn.pi_)->use_count_ = (local_58.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    Rule::E(&local_48,&local_58);
    RHS = Rule::operator<<(&local_48,t);
    prod(this,LHS,RHS);
    Rule::~Rule(&local_48);
    boost::detail::shared_count::~shared_count(&local_58.pn);
    t = LHS;
  }
  return (Sym)t.x;
}

Assistant:

Sym replaceTerminal (Sym t)
    {
      if (t.isVar ()) return t;

      Sym nt = newVar();
      prod (nt, Rule::E(_tfac) << t);
      return nt;
    }